

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eth_linux.c
# Opt level: O0

int csp_eth_tx_frame(void *driver_data,csp_eth_header_t *eth_frame)

{
  __uint16_t _Var1;
  ssize_t sVar2;
  char *in_RSI;
  long in_RDI;
  uint32_t txsize;
  sockaddr_ll socket_address;
  eth_context_t *ctx;
  sockaddr local_34;
  undefined2 local_24;
  long local_20;
  char *local_18;
  int local_4;
  
  local_20 = in_RDI;
  local_18 = in_RSI;
  memset(&local_34,0,0x14);
  local_34.sa_data._2_4_ = *(undefined4 *)(local_20 + 0xb0);
  local_34.sa_data[9] = '\x06';
  local_34.sa_data._10_4_ = *(undefined4 *)local_18;
  local_24 = *(undefined2 *)(local_18 + 4);
  _Var1 = __bswap_16(*(__uint16_t *)(local_18 + 0x12));
  sVar2 = sendto(*(int *)(local_20 + 0x98),local_18,(ulong)(_Var1 + 0x16),0,&local_34,0x14);
  if (sVar2 < 0) {
    local_4 = -0xb;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int csp_eth_tx_frame(void * driver_data, csp_eth_header_t *eth_frame) {

    const eth_context_t * ctx = (eth_context_t*)driver_data;

    /* Destination socket address */
    struct sockaddr_ll socket_address = {};
    socket_address.sll_ifindex = ctx->if_idx.ifr_ifindex;
    socket_address.sll_halen = CSP_ETH_ALEN;
    memcpy(socket_address.sll_addr, eth_frame->ether_dhost, CSP_ETH_ALEN);

    uint32_t txsize = sizeof(csp_eth_header_t) + be16toh(eth_frame->seg_size);

    if (sendto(ctx->sockfd, (void*)eth_frame, txsize, 0, (struct sockaddr*)&socket_address, sizeof(struct sockaddr_ll)) < 0) {
        return CSP_ERR_DRIVER;
    }

    return CSP_ERR_NONE;
}